

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplaceRealloc<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,pointer pos,
          DefinitionSymbol *args,SourceRange *args_1)

{
  undefined8 *puVar1;
  SourceLocation *pSVar2;
  undefined8 *puVar3;
  ulong uVar4;
  pointer p;
  SourceLocation SVar5;
  DefinitionSymbol *pDVar6;
  ConfigRule *pCVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pTVar11;
  pointer pTVar12;
  pointer pTVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar4 = this->cap;
  if (uVar16 < uVar4 * 2) {
    uVar16 = uVar4 * 2;
  }
  if (0x3ffffffffffffff - uVar4 < uVar4) {
    uVar16 = 0x3ffffffffffffff;
  }
  lVar17 = (long)pos - (long)this->data_;
  pTVar13 = (pointer)operator_new(uVar16 << 5);
  *(DefinitionSymbol **)((long)pTVar13 + lVar17) = args;
  *(undefined8 *)((long)pTVar13 + lVar17 + 8) = 0;
  SVar5 = args_1->endLoc;
  pSVar2 = (SourceLocation *)((long)pTVar13 + lVar17 + 0x10);
  *pSVar2 = args_1->startLoc;
  pSVar2[1] = SVar5;
  p = this->data_;
  lVar14 = this->len * 0x20;
  lVar15 = (long)p + (lVar14 - (long)pos);
  pTVar11 = p;
  pTVar12 = pTVar13;
  if (lVar15 == 0) {
    if (this->len != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->definition + lVar15);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)(&(p->sourceRange).startLoc.field_0x0 + lVar15);
        uVar10 = puVar1[1];
        puVar3 = (undefined8 *)(&(pTVar13->sourceRange).startLoc.field_0x0 + lVar15);
        *puVar3 = *puVar1;
        puVar3[1] = uVar10;
        puVar1 = (undefined8 *)((long)&pTVar13->definition + lVar15);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        lVar15 = lVar15 + 0x20;
      } while (lVar14 != lVar15);
    }
  }
  else {
    for (; pTVar11 != pos; pTVar11 = pTVar11 + 1) {
      pDVar6 = pTVar11->definition;
      pCVar7 = pTVar11->rule;
      SVar5 = (pTVar11->sourceRange).endLoc;
      (pTVar12->sourceRange).startLoc = (pTVar11->sourceRange).startLoc;
      (pTVar12->sourceRange).endLoc = SVar5;
      pTVar12->definition = pDVar6;
      pTVar12->rule = pCVar7;
      pTVar12 = pTVar12 + 1;
    }
    memcpy((void *)((long)pTVar13 + lVar17 + 0x20),pos,(lVar15 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pTVar13;
  return (pointer)((long)pTVar13 + lVar17);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}